

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

size_t Curl_multissl_version(char *buffer,size_t size)

{
  long lVar1;
  size_t sVar2;
  Curl_ssl *pCVar3;
  Curl_ssl *pCVar4;
  long lVar5;
  char *pcVar6;
  
  pCVar3 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar3 = available_backends[0];
  }
  if (pCVar3 != Curl_multissl_version::selected) {
    lVar5 = 0;
    pcVar6 = Curl_multissl_version::backends;
    pCVar4 = available_backends[0];
    Curl_multissl_version::selected = pCVar3;
    while (pCVar4 != (Curl_ssl *)0x0) {
      if (lVar5 != 0) {
        *pcVar6 = ' ';
        pcVar6 = pcVar6 + 1;
        pCVar4 = available_backends[lVar5];
      }
      if (pCVar3 != pCVar4) {
        *pcVar6 = '(';
        pcVar6 = pcVar6 + 1;
        pCVar4 = available_backends[lVar5];
      }
      sVar2 = (*pCVar4->version)(pcVar6,(long)&Curl_multissl_version::total - (long)pcVar6);
      pCVar3 = Curl_multissl_version::selected;
      pcVar6 = pcVar6 + sVar2;
      if (Curl_multissl_version::selected != available_backends[lVar5]) {
        *pcVar6 = ')';
        pcVar6 = pcVar6 + 1;
      }
      lVar1 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      pCVar4 = available_backends[lVar1];
    }
    *pcVar6 = '\0';
    Curl_multissl_version::total = (size_t)(pcVar6 + -0x162d10);
  }
  sVar2 = Curl_multissl_version::total;
  if (size < Curl_multissl_version::total) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  return sVar2;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    int i;

    selected = current;

    for(i = 0; available_backends[i]; i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, backends + sizeof(backends) - p);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size < total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return total;
}